

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

CoverageOptionSyntax * __thiscall
slang::parsing::Parser::parseCoverageOption(Parser *this,AttrList attributes)

{
  SyntaxNode *expr_00;
  bool bVar1;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_c8;
  SourceRange local_98;
  DiagCode local_84;
  SyntaxNode *local_80;
  ExpressionSyntax *expr;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [8];
  Token token;
  Parser *this_local;
  AttrList attributes_local;
  
  token.info = (Info *)this;
  _local_38 = ParserBase::peek(&this->super_ParserBase);
  if (local_38._0_2_ == Identifier) {
    local_48 = Token::valueText((Token *)local_38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"option");
    bVar1 = std::operator==(local_48,local_58);
    if (!bVar1) {
      local_68 = Token::valueText((Token *)local_38);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&expr,"type_option");
      bVar1 = std::operator==(local_68,_expr);
      if (!bVar1) goto LAB_005846b1;
    }
    local_80 = &parseExpression(this)->super_SyntaxNode;
    bVar1 = isValidOption((ExpressionSyntax *)local_80);
    if (!bVar1) {
      local_84.subsystem = Parser;
      local_84.code = 0x54;
      local_98 = slang::syntax::SyntaxNode::sourceRange(local_80);
      ParserBase::addDiag(&this->super_ParserBase,local_84,local_98);
    }
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_c8,attributes);
    expr_00 = local_80;
    semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
    attributes_local.size_ =
         (size_type)
         slang::syntax::SyntaxFactory::coverageOption
                   (&this->factory,&local_c8,(ExpressionSyntax *)expr_00,semi);
  }
  else {
LAB_005846b1:
    attributes_local.size_ = 0;
  }
  return (CoverageOptionSyntax *)attributes_local.size_;
}

Assistant:

CoverageOptionSyntax* Parser::parseCoverageOption(AttrList attributes) {
    auto token = peek();
    if (token.kind == TokenKind::Identifier) {
        if (token.valueText() == "option" || token.valueText() == "type_option") {
            auto& expr = parseExpression();
            if (!isValidOption(expr))
                addDiag(diag::InvalidCoverageOption, expr.sourceRange());

            return &factory.coverageOption(attributes, expr, expect(TokenKind::Semicolon));
        }
    }
    return nullptr;
}